

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O0

void __thiscall
Time::runNested(Time *this,unsigned_long_long steps,unsigned_long_long runs,DataCollector *runHelper
               ,ostream *log)

{
  reference pvVar1;
  ulong local_68;
  unsigned_long_long r;
  value_type_conflict4 local_50;
  undefined1 local_48 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> runNumbers;
  ostream *log_local;
  DataCollector *runHelper_local;
  unsigned_long_long runs_local;
  unsigned_long_long steps_local;
  Time *this_local;
  
  runNumbers.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)log;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  local_50 = 0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48,&local_50);
  for (local_68 = 0; local_68 < runs; local_68 = local_68 + 1) {
    pvVar1 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48,
                        0);
    *pvVar1 = local_68;
    if (runHelper != (DataCollector *)0x0) {
      (*(code *)**(undefined8 **)runHelper)(runHelper,local_48);
    }
    run(this,steps,
        (ostream *)
        runNumbers.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage,true);
    if (runHelper != (DataCollector *)0x0) {
      (**(code **)(*(long *)runHelper + 8))(runHelper,local_48);
    }
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  return;
}

Assistant:

void Time::runNested( unsigned long long steps, unsigned long long runs, DataCollector *runHelper, ostream &log )
{
	vector<unsigned long long> runNumbers;
	runNumbers.push_back(0);
	for (unsigned long long r=0; r<runs; ++r) {
		runNumbers[0] = r;
		if (runHelper)
			runHelper->beforeRun(runNumbers);
		run(steps, log);
		if (runHelper)
			runHelper->afterRun(runNumbers);
	}
}